

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

bool __thiscall State::moveDown(State *this,State *s)

{
  State *this_00;
  bool bVar1;
  State *s_local;
  State *this_local;
  
  bVar1 = (this->blank).height != this->height + -1;
  if (bVar1) {
    operator=(s,this);
    moveX(s,1);
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return bVar1;
}

Assistant:

bool State::moveDown(State &s) {
    if (blank.height == height - 1) {
        return false;
    }

    s = *this;
    s.moveX(+1);
    s.previous = new State(*this);
    return true;
}